

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenStructNewInsertOperandAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef operandExpr)

{
  if (expr->_id != StructNewId) {
    __assert_fail("expression->is<StructNew>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x105e,
                  "void BinaryenStructNewInsertOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  if (operandExpr != (BinaryenExpressionRef)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::insertAt
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(expr + 1),
               (ulong)index,operandExpr);
    return;
  }
  __assert_fail("operandExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x105f,
                "void BinaryenStructNewInsertOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenStructNewInsertOperandAt(BinaryenExpressionRef expr,
                                      BinaryenIndex index,
                                      BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StructNew>());
  assert(operandExpr);
  static_cast<StructNew*>(expression)
    ->operands.insertAt(index, (Expression*)operandExpr);
}